

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O3

int Gia_ManCollectReachable(Gia_Man_t *pAig,int nStatesMax,int fMiter,int fDumpFile,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Gia_ManEra_t *p;
  Gia_ObjEra_t *pGVar5;
  long lVar6;
  FILE *__stream;
  int level;
  char *__format;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  timespec ts;
  timespec local_60;
  long local_50;
  int local_44;
  Gia_Man_t *local_40;
  double local_38;
  
  local_44 = fVerbose;
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    local_50 = -1;
  }
  else {
    local_50 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  if (0xc < pAig->vCis->nSize - pAig->nRegs) {
    __assert_fail("Gia_ManPiNum(pAig) <= 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                  ,0x216,"int Gia_ManCollectReachable(Gia_Man_t *, int, int, int, int)");
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                  ,0x217,"int Gia_ManCollectReachable(Gia_Man_t *, int, int, int, int)");
  }
  local_40 = pAig;
  p = Gia_ManEraCreate(pAig);
  pGVar5 = Gia_ManEraCreateState(p);
  pGVar5->Cond = 0;
  pGVar5->iPrev = 0;
  pGVar5->iNext = 0;
  lVar7 = (long)p->nWordsDat;
  uVar9 = 0;
  memset(pGVar5 + 1,0,lVar7 * 4);
  if (0 < lVar7) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 ^ Gia_ManEraStateHash::s_FPrimes[(uint)lVar6 & 0x7f] * (&pGVar5[1].Num)[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  p->pBins[(int)(uVar9 % (uint)p->nBins)] = pGVar5->Num;
  uVar9 = p->iCurState;
  pVVar8 = p->vStates;
  iVar1 = pVVar8->nSize;
  if ((int)uVar9 < iVar1 + -1) {
    do {
      if (nStatesMax <= iVar1) {
        printf("Reached the limit on states traversed (%d).  ",(ulong)(uint)nStatesMax);
        iVar1 = -1;
        goto LAB_0069b819;
      }
      uVar3 = uVar9 + 1;
      p->iCurState = uVar3;
      if ((int)uVar9 < -1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pGVar5 = (Gia_ObjEra_t *)pVVar8->pArray[uVar3];
      if ((uVar3 < 2) || (uVar9 = uVar3, pGVar5->iPrev != 0)) {
        Gia_ManInsertState(p,pGVar5);
        Gia_ManPerformOneIter(p);
        iVar1 = Gia_ManAnalyzeResult(p,pGVar5,fMiter,fDumpFile);
        uVar9 = p->iCurState;
        if ((fMiter != 0) && (iVar1 != 0)) {
          iVar1 = 0;
          printf("Miter failed in state %d after %d transitions.  ",(ulong)uVar9,
                 (ulong)(p->vBugTrace->nSize - 1));
          goto LAB_0069b819;
        }
        if (local_44 == 0) {
          pVVar8 = p->vStates;
        }
        else {
          pVVar8 = p->vStates;
          if ((uVar9 * 0x3afb7e91 + 0x346dc0 >> 3 | uVar9 * 0x20000000) < 0xd1b71) {
            uVar3 = pVVar8->nSize;
            local_38 = (double)(int)uVar9 / (double)(int)uVar3;
            uVar2 = Gia_ManCountDepth(p);
            lVar7 = (long)p->nWordsDat * 4 + 0x10;
            auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar10._0_8_ = lVar7;
            auVar10._12_4_ = 0x45300000;
            iVar1 = 0x92b3c1;
            printf("States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ",local_38,
                   ((double)pVVar8->nCap * 8.0 +
                   (double)p->nBins * 4.0 +
                   ((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) *
                   (double)pVVar8->nSize) * 9.5367431640625e-07,(ulong)uVar9,(ulong)uVar3,
                   (ulong)uVar2);
            Abc_Print(iVar1,"%s =","Time");
            iVar4 = 3;
            iVar1 = clock_gettime(3,&local_60);
            if (iVar1 < 0) {
              lVar7 = -1;
            }
            else {
              lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
            }
            Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar7 - local_50) / 1000000.0);
          }
        }
      }
      iVar1 = pVVar8->nSize;
    } while ((int)uVar9 < iVar1 + -1);
  }
  iVar1 = 1;
LAB_0069b819:
  uVar3 = Gia_ManCountDepth(p);
  iVar4 = 0x92b406;
  printf("Reachability analysis traversed %d states with depth %d.  ",(ulong)(uVar9 - 1),
         (ulong)uVar3);
  Abc_Print(iVar4,"%s =","Time");
  level = 3;
  iVar4 = clock_gettime(3,&local_60);
  if (iVar4 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar7 - local_50) / 1000000.0);
  if (fDumpFile != 0) {
    __stream = fopen("test.stg","wb");
    if (__stream == (FILE *)0x0) {
      __format = "Cannot open file \"%s\" for writing.\n";
    }
    else {
      Gia_ManStgPrint((FILE *)__stream,p->vStgDump,local_40->vCis->nSize - local_40->nRegs,
                      local_40->vCos->nSize - local_40->nRegs,uVar9 - 1);
      fclose(__stream);
      __format = "Extracted STG was written into file \"%s\".\n";
    }
    printf(__format,"test.stg");
  }
  Gia_ManEraFree(p);
  return iVar1;
}

Assistant:

int Gia_ManCollectReachable( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fDumpFile, int fVerbose )
{ 
    Gia_ManEra_t * p;
    Gia_ObjEra_t * pState;
    int Hash;
    abctime clk = Abc_Clock();
    int RetValue = 1;
    assert( Gia_ManPiNum(pAig) <= 12 );
    assert( Gia_ManRegNum(pAig) > 0 );
    p = Gia_ManEraCreate( pAig );
    // create init state
    pState = Gia_ManEraCreateState( p );
    pState->Cond  = 0; 
    pState->iPrev = 0;
    pState->iNext = 0; 
    memset( pState->pData, 0, sizeof(unsigned) * p->nWordsDat );
    Hash = Gia_ManEraStateHash(pState->pData, p->nWordsDat, p->nBins);
    p->pBins[ Hash ] = pState->Num;
    // process reachable states
    while ( p->iCurState < Vec_PtrSize( p->vStates ) - 1 )
    {
        if ( Vec_PtrSize(p->vStates) >= nStatesMax )
        {
            printf( "Reached the limit on states traversed (%d).  ", nStatesMax );
            RetValue = -1;
            break;
        }
        pState = Gia_ManEraState( p, ++p->iCurState );
        if ( p->iCurState > 1 && pState->iPrev == 0 )
            continue;
//printf( "Extracting %d  ", p->iCurState );
//Extra_PrintBinary( stdout, p->pStateNew->pData, Gia_ManRegNum(p->pAig) );  printf( "\n" );
        Gia_ManInsertState( p, pState );
        Gia_ManPerformOneIter( p );
        if ( Gia_ManAnalyzeResult( p, pState, fMiter, fDumpFile ) && fMiter )
        {
            RetValue = 0;
            printf( "Miter failed in state %d after %d transitions.  ", 
                p->iCurState, Vec_IntSize(p->vBugTrace)-1 );
            break;
        }
        if ( fVerbose && p->iCurState % 5000 == 0 )
        {
            printf( "States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ", 
                p->iCurState, Vec_PtrSize(p->vStates), 1.0*p->iCurState/Vec_PtrSize(p->vStates), Gia_ManCountDepth(p), 
                (1.0/(1<<20))*(1.0*Vec_PtrSize(p->vStates)*(sizeof(Gia_ObjEra_t) + sizeof(unsigned) * p->nWordsDat) + 
                   1.0*p->nBins*sizeof(unsigned) + 1.0*p->vStates->nCap * sizeof(void*)) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    printf( "Reachability analysis traversed %d states with depth %d.  ", p->iCurState-1, Gia_ManCountDepth(p) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    if ( fDumpFile )
    {
        char * pFileName = "test.stg";
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            Gia_ManStgPrint( pFile, p->vStgDump, Gia_ManPiNum(pAig), Gia_ManPoNum(pAig), p->iCurState-1 );
            fclose( pFile );
            printf( "Extracted STG was written into file \"%s\".\n", pFileName );
        }
    }
    Gia_ManEraFree( p );
    return RetValue;
}